

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall
RegisterSubprocessTestInterruptParent::RegisterSubprocessTestInterruptParent
          (RegisterSubprocessTestInterruptParent *this)

{
  RegisterSubprocessTestInterruptParent *this_local;
  
  RegisterTest(SubprocessTestInterruptParent::Create,"SubprocessTest.InterruptParent");
  return;
}

Assistant:

TEST_F(SubprocessTest, InterruptParent) {
  Subprocess* subproc = subprocs_.Add("kill -INT $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork(NULL);
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}